

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

_Bool SaveStorageValue(uint position,int value)

{
  int *piVar1;
  uchar *data;
  int *dataPtr_2;
  int *dataPtr_1;
  int *dataPtr;
  uchar *newFileData;
  uchar *fileData;
  uint newDataSize;
  uint dataSize;
  char path [512];
  _Bool success;
  int value_local;
  uint position_local;
  
  path[0x1ff] = '\0';
  memset(&newDataSize,0,0x200);
  strcpy((char *)&newDataSize,"storage.data");
  fileData._4_4_ = 0;
  fileData._0_4_ = 0;
  dataPtr = (int *)LoadFileData((char *)&newDataSize,(uint *)((long)&fileData + 4));
  if (dataPtr == (int *)0x0) {
    TraceLog(3,"FILEIO: [%s] File not found, creating it",&newDataSize);
    fileData._4_4_ = (position + 1) * 4;
    data = (uchar *)malloc((ulong)fileData._4_4_);
    *(int *)(data + (ulong)position * 4) = value;
    path[0x1ff] = SaveFileData((char *)&newDataSize,data,fileData._4_4_);
    UnloadFileData(data);
  }
  else {
    if ((ulong)position << 2 < (ulong)fileData._4_4_) {
      fileData._0_4_ = fileData._4_4_;
      dataPtr[position] = value;
    }
    else {
      fileData._0_4_ = (position + 1) * 4;
      piVar1 = (int *)realloc(dataPtr,(ulong)(uint)fileData);
      if (piVar1 == (int *)0x0) {
        TraceLog(4,
                 "FILEIO: [%s] Failed to realloc data (%u), position in bytes (%u) bigger than actual file size"
                 ,&newDataSize,(ulong)fileData._4_4_,(ulong)position << 2);
        fileData._0_4_ = fileData._4_4_;
      }
      else {
        piVar1[position] = value;
        dataPtr = piVar1;
      }
    }
    path[0x1ff] = SaveFileData((char *)&newDataSize,dataPtr,(uint)fileData);
    free(dataPtr);
  }
  return (_Bool)(path[0x1ff] & 1);
}

Assistant:

bool SaveStorageValue(unsigned int position, int value)
{
    bool success = false;

#if defined(SUPPORT_DATA_STORAGE)
    char path[512] = { 0 };
#if defined(PLATFORM_ANDROID)
    strcpy(path, CORE.Android.internalDataPath);
    strcat(path, "/");
    strcat(path, STORAGE_DATA_FILE);
#elif defined(PLATFORM_UWP)
    strcpy(path, CORE.UWP.internalDataPath);
    strcat(path, "/");
    strcat(path, STORAGE_DATA_FILE);
#else
    strcpy(path, STORAGE_DATA_FILE);
#endif

    unsigned int dataSize = 0;
    unsigned int newDataSize = 0;
    unsigned char *fileData = LoadFileData(path, &dataSize);
    unsigned char *newFileData = NULL;

    if (fileData != NULL)
    {
        if (dataSize <= (position*sizeof(int)))
        {
            // Increase data size up to position and store value
            newDataSize = (position + 1)*sizeof(int);
            newFileData = (unsigned char *)RL_REALLOC(fileData, newDataSize);

            if (newFileData != NULL)
            {
                // RL_REALLOC succeded
                int *dataPtr = (int *)newFileData;
                dataPtr[position] = value;
            }
            else
            {
                // RL_REALLOC failed
                TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to realloc data (%u), position in bytes (%u) bigger than actual file size", path, dataSize, position*sizeof(int));

                // We store the old size of the file
                newFileData = fileData;
                newDataSize = dataSize;
            }
        }
        else
        {
            // Store the old size of the file
            newFileData = fileData;
            newDataSize = dataSize;

            // Replace value on selected position
            int *dataPtr = (int *)newFileData;
            dataPtr[position] = value;
        }

        success = SaveFileData(path, newFileData, newDataSize);
        RL_FREE(newFileData);
    }
    else
    {
        TRACELOG(LOG_INFO, "FILEIO: [%s] File not found, creating it", path);

        dataSize = (position + 1)*sizeof(int);
        fileData = (unsigned char *)RL_MALLOC(dataSize);
        int *dataPtr = (int *)fileData;
        dataPtr[position] = value;

        success = SaveFileData(path, fileData, dataSize);
        UnloadFileData(fileData);
    }
#endif

    return success;
}